

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

void verb_prog_evoke_stone(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  return;
}

Assistant:

void verb_prog_evoke_stone(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	/* Morg - Leave the code compilable.  Please.
	OBJ_AFFECT_DATA *oaf;
	int chance;

	oaf = affect_find_obj(obj->affected,gsn_imbue_stone);

	if(!oaf)
	{
		send_to_char("This stone is not powered by natural energy.\n\r");
		return;
	}

	if(ch->Class()->name != "druid")
	{
		send_to_char("This stone is useless to you.\n\r");
		return;
	}

	if(obj->value[1] < 1)
	{
		send_to_char("The energy of this stone has been depleted.\n\r");
		return;
	}

	if(obj->value[0] == 0)
	{
		send_to_char("This stone has not been imbued.\n\r");
		return;
	}

	if(obj->value[0] == 1)
	{
		chance = number_percent();

		if(chance < 23)
		{
		}
	}
	*/
}